

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esni.c
# Opt level: O3

int main(int argc,char **argv)

{
  st_x9_62_keyex_context_t *ctx;
  size_t sVar1;
  size_t sVar2;
  FILE *__s;
  int iVar3;
  int extraout_EAX;
  uint uVar4;
  int iVar5;
  FILE *pFVar6;
  EVP_PKEY *pkey;
  size_t len;
  ptls_cipher_suite_t *ppVar7;
  ulong uVar8;
  long lVar9;
  st_x9_62_keyex_context_t *extraout_RAX;
  ec_key_st *key;
  EC_GROUP *group;
  ptls_cipher_suite_t **pppVar10;
  char *pkey_00;
  FILE *ctx_00;
  ptls_key_exchange_context_t **_ctx;
  ptls_key_exchange_algorithm_t *algo;
  char **ppcVar11;
  uint16_t padded_length;
  uint64_t _v;
  uint64_t lifetime;
  anon_struct_2056_2_5014a043 key_exchanges;
  st_x9_62_keyex_context_t *psStack_1118;
  char *pcStack_1110;
  char **ppcStack_1108;
  FILE *pFStack_1100;
  FILE *pFStack_10f8;
  code *pcStack_10f0;
  ushort local_10e2;
  ptls_buffer_t local_10e0;
  undefined1 local_10be;
  undefined1 local_10bd;
  ushort local_10bc;
  ushort local_10ba;
  ulong local_10b8;
  long local_10b0;
  ptls_cipher_suite_t **local_10a8;
  undefined2 local_109c;
  undefined2 local_109a;
  FILE *local_1098;
  FILE *local_1090;
  long local_1088;
  undefined4 local_107c;
  ulong local_1078;
  ulong local_1070;
  undefined4 local_1068 [10];
  ptls_cipher_suite_t *local_1040 [256];
  ulong local_840;
  FILE local_838 [9];
  long local_38;
  
  pcStack_10f0 = (code *)0x105c8e;
  OPENSSL_init_crypto(2);
  pcStack_10f0 = (code *)0x105c9a;
  OPENSSL_init_crypto(0xc);
  pcStack_10f0 = (code *)0x105c9f;
  ENGINE_load_builtin_engines();
  pcStack_10f0 = (code *)0x105ca4;
  ENGINE_register_all_ciphers();
  pcStack_10f0 = (code *)0x105ca9;
  ENGINE_register_all_digests();
  pcStack_10f0 = (code *)0x105cbd;
  memset(local_838,0,0x808);
  pcStack_10f0 = (code *)0x105cd1;
  memset(local_1040,0,0x800);
  local_10e2 = 0x104;
  local_10b0 = 0x76a700;
  local_10a8 = ptls_openssl_cipher_suites + 1;
  local_10b8 = 0;
  local_1098 = (FILE *)0x0;
  local_1090 = (FILE *)0x0;
LAB_00105d27:
  pcStack_10f0 = (code *)0x105d34;
  pkey_00 = (char *)argv;
  ctx_00 = (FILE *)(ulong)(uint)argc;
  iVar3 = getopt(argc,argv,"n:K:c:d:p:o:h");
  __s = local_1090;
  pFVar6 = _optarg;
  switch(iVar3) {
  case 99:
    ppVar7 = ptls_openssl_cipher_suites[0];
    pppVar10 = local_10a8;
    while( true ) {
      if (ppVar7 == (ptls_cipher_suite_t *)0x0) {
        pcStack_10f0 = (code *)0x10634e;
        main_cold_3();
        goto switchD_00105d43_caseD_68;
      }
      pcStack_10f0 = (code *)0x105e76;
      iVar3 = strcasecmp(ppVar7->aead->name,(char *)pFVar6);
      if (iVar3 == 0) break;
      ppVar7 = *pppVar10;
      pppVar10 = pppVar10 + 1;
    }
    local_1040[local_10b8] = ppVar7;
    local_10b8 = local_10b8 + 1;
    goto LAB_00105d27;
  case 100:
    pkey_00 = "%lu";
    pcStack_10f0 = (code *)0x105d5c;
    ctx_00 = _optarg;
    iVar3 = __isoc99_sscanf(_optarg,"%lu",&local_10b0);
    if ((iVar3 == 1) && (local_10b0 != 0)) {
      local_10b0 = local_10b0 * 0x15180;
      goto LAB_00105d27;
    }
    break;
  case 0x65:
  case 0x66:
  case 0x67:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
switchD_00105d43_caseD_65:
    pcStack_10f0 = (code *)0x10633c;
    printf("picotls-esni - generates an ESNI Resource Record\n\nUsage: %s [options]\nOptions:\n  -n <published-sni>  published sni value\n  -K <key-file>       private key files (repeat the option to include multiple\n                      keys)\n  -c <cipher-suite>   aes128-gcm, chacha20-poly1305, ...\n  -d <days>           number of days until expiration (default: 90)\n  -p <padded-length>  padded length (default: 260)\n  -o <output-file>    write output to specified file instead of stdout\n                      (use on Windows as stdout is not binary there)\n  -h                  prints this help\n\n-c and -x can be used multiple times.\n\n"
           ,*argv);
    goto LAB_0010633c;
  case 0x68:
switchD_00105d43_caseD_68:
    pcStack_10f0 = (code *)0x10635f;
    printf("picotls-esni - generates an ESNI Resource Record\n\nUsage: %s [options]\nOptions:\n  -n <published-sni>  published sni value\n  -K <key-file>       private key files (repeat the option to include multiple\n                      keys)\n  -c <cipher-suite>   aes128-gcm, chacha20-poly1305, ...\n  -d <days>           number of days until expiration (default: 90)\n  -p <padded-length>  padded length (default: 260)\n  -o <output-file>    write output to specified file instead of stdout\n                      (use on Windows as stdout is not binary there)\n  -h                  prints this help\n\n-c and -x can be used multiple times.\n\n"
           ,*argv);
    pcStack_10f0 = (code *)0x106366;
    exit(0);
  case 0x6e:
    local_1090 = _optarg;
    goto LAB_00105d27;
  case 0x6f:
    local_1098 = _optarg;
    goto LAB_00105d27;
  case 0x70:
    goto switchD_00105d43_caseD_70;
  default:
    if (iVar3 != 0x4b) {
      if (iVar3 != -1) goto switchD_00105d43_caseD_65;
      local_840 = local_10b8;
      if (local_10b8 == 0) {
        local_840 = 1;
        local_1040[0] = &ptls_openssl_aes128gcmsha256;
      }
      pFVar6 = local_1090;
      if (local_38 == 0) goto LAB_0010637f;
      local_10a8 = (ptls_cipher_suite_t **)CONCAT44(local_10a8._4_4_,(uint)local_10e2);
      pcStack_10f0 = (code *)0x105f1b;
      local_10b8 = time((time_t *)0x0);
      local_1088 = local_10b0;
      local_10e0.base = "";
      local_10e0.capacity = 0;
      local_10e0.off = 0;
      local_10e0.is_allocated = 0;
      local_109a = 0x2ff;
      pcStack_10f0 = (code *)0x105f5b;
      iVar3 = ptls_buffer__do_pushv(&local_10e0,&local_109a,2);
      if (iVar3 != 0) goto LAB_001062ff;
      local_107c = 0;
      pcStack_10f0 = (code *)0x105f7d;
      iVar3 = ptls_buffer__do_pushv(&local_10e0,&local_107c,4);
      if (iVar3 != 0) goto LAB_001062ff;
      if (__s == (FILE *)0x0) {
        local_109c = 0;
        pcStack_10f0 = (code *)0x106004;
        iVar3 = ptls_buffer__do_pushv(&local_10e0,&local_109c,2);
        if (iVar3 != 0) goto LAB_001062ff;
      }
      else {
        pcStack_10f0 = (code *)0x105fa0;
        iVar3 = ptls_buffer__do_pushv(&local_10e0,"",2);
        sVar1 = local_10e0.off;
        if (iVar3 != 0) goto LAB_001062ff;
        pcStack_10f0 = (code *)0x105fb9;
        len = strlen((char *)__s);
        pcStack_10f0 = (code *)0x105fc7;
        iVar3 = ptls_buffer__do_pushv(&local_10e0,__s,len);
        if (iVar3 != 0) goto LAB_001062ff;
        local_10e0.base[sVar1 - 2] = (uint8_t)(local_10e0.off - sVar1 >> 8);
        local_10e0.base[sVar1 - 1] = (uint8_t)(local_10e0.off - sVar1);
      }
      pcStack_10f0 = (code *)0x106022;
      iVar3 = ptls_buffer__do_pushv(&local_10e0,"",2);
      sVar1 = local_10e0.off;
      if (iVar3 != 0) goto LAB_001062ff;
      if ((char *)local_838[0]._0_8_ == (char *)0x0) goto LAB_001060f2;
      ppcVar11 = &local_838[0]._IO_read_ptr;
      goto LAB_0010605f;
    }
    pkey_00 = "rt";
    pcStack_10f0 = (code *)0x105d9a;
    ctx_00 = _optarg;
    pFVar6 = fopen((char *)_optarg,"rt");
    if (pFVar6 == (FILE *)0x0) {
LAB_0010636b:
      pcStack_10f0 = (code *)0x106370;
      main_cold_6();
    }
    else {
      pkey_00 = (char *)0x0;
      pcStack_10f0 = (code *)0x105db4;
      ctx_00 = pFVar6;
      pkey = PEM_read_PrivateKey(pFVar6,(EVP_PKEY **)0x0,(undefined1 *)0x0,(void *)0x0);
      if (pkey != (EVP_PKEY *)0x0) {
        pcStack_10f0 = (code *)0x105dc8;
        fclose(pFVar6);
        ctx_00 = (FILE *)(&local_838[0]._flags + local_38 * 2);
        pcStack_10f0 = (code *)0x105def;
        pkey_00 = (char *)pkey;
        local_38 = local_38 + 1;
        iVar3 = ptls_openssl_create_key_exchange
                          ((ptls_key_exchange_context_t **)ctx_00,(EVP_PKEY *)pkey);
        if (iVar3 != 0) {
          pcStack_10f0 = (code *)0x10636b;
          main_cold_4();
          goto LAB_0010636b;
        }
        pcStack_10f0 = (code *)0x105dff;
        EVP_PKEY_free(pkey);
        goto LAB_00105d27;
      }
    }
    pcStack_10f0 = (code *)0x106375;
    main_cold_5();
  }
  pcStack_10f0 = (code *)0x10637a;
  main_cold_2();
LAB_0010637a:
  pcStack_10f0 = (code *)0x10637f;
  main_cold_1();
  pFVar6 = (FILE *)&switchD_00105d43::switchdataD_00116004;
LAB_0010637f:
  pcStack_10f0 = ptls_openssl_random_bytes;
  main_cold_8();
  pFStack_10f8 = (FILE *)0x10638a;
  pcStack_10f0._0_4_ = extraout_EAX;
  uVar4 = RAND_bytes((uchar *)ctx_00,(int)pkey_00);
  if (uVar4 == 1) {
    return (int)pcStack_10f0;
  }
  _ctx = (ptls_key_exchange_context_t **)(ulong)uVar4;
  pFStack_10f8 = (FILE *)ptls_openssl_create_key_exchange;
  ptls_openssl_random_bytes_cold_1();
  pcStack_1110 = "n:K:c:d:p:o:h";
  psStack_1118 = extraout_RAX;
  ppcStack_1108 = argv;
  pFStack_1100 = pFVar6;
  pFStack_10f8 = (FILE *)(ulong)(uint)argc;
  iVar3 = EVP_PKEY_get_id(pkey_00);
  if (iVar3 == 0x40a) {
    iVar3 = evp_keyex_init(&ptls_openssl_x25519,_ctx,(EVP_PKEY *)pkey_00);
    if (iVar3 == 0) {
      EVP_PKEY_up_ref(pkey_00);
      return 0;
    }
    return iVar3;
  }
  iVar5 = 0x204;
  if (iVar3 != 0x198) {
    return 0x204;
  }
  key = EVP_PKEY_get1_EC_KEY((EVP_PKEY *)pkey_00);
  group = EC_KEY_get0_group(key);
  iVar3 = EC_GROUP_get_curve_name(group);
  if (iVar3 == 0x19f) {
    algo = &ptls_openssl_secp256r1;
  }
  else if (iVar3 == 0x2cc) {
    algo = &ptls_openssl_secp521r1;
  }
  else {
    if (iVar3 != 0x2cb) goto LAB_00106472;
    algo = &ptls_openssl_secp384r1;
  }
  psStack_1118 = (st_x9_62_keyex_context_t *)0x0;
  iVar5 = x9_62_create_context(algo,&psStack_1118);
  ctx = psStack_1118;
  if (iVar5 == 0) {
    psStack_1118->privkey = (EC_KEY *)key;
    iVar5 = x9_62_setup_pubkey(psStack_1118);
    if (iVar5 == 0) {
      *_ctx = &ctx->super;
      return 0;
    }
LAB_00106463:
    x9_62_free_context(ctx);
  }
  else if (psStack_1118 != (st_x9_62_keyex_context_t *)0x0) goto LAB_00106463;
  *_ctx = (ptls_key_exchange_context_t *)0x0;
LAB_00106472:
  EC_KEY_free(key);
  return iVar5;
switchD_00105d43_caseD_70:
  pkey_00 = "%hu";
  pcStack_10f0 = (code *)0x105e22;
  ctx_00 = _optarg;
  iVar3 = __isoc99_sscanf(_optarg,"%hu",&local_10e2);
  if ((iVar3 != 1) || (local_10e2 == 0)) goto LAB_0010637a;
  goto LAB_00105d27;
  while( true ) {
    pcStack_10f0 = (code *)0x106096;
    iVar3 = ptls_buffer__do_pushv(&local_10e0,"",2);
    sVar2 = local_10e0.off;
    if (iVar3 != 0) goto LAB_001062ff;
    pcStack_10f0 = (code *)0x1060b7;
    iVar3 = ptls_buffer__do_pushv
                      (&local_10e0,*(void **)(*(long *)(ppcVar11 + -1) + 8),
                       *(size_t *)(*(long *)(ppcVar11 + -1) + 0x10));
    if (iVar3 != 0) goto LAB_001062ff;
    local_10e0.base[sVar2 - 2] = (uint8_t)(local_10e0.off - sVar2 >> 8);
    local_10e0.base[sVar2 - 1] = (uint8_t)(local_10e0.off - sVar2);
    local_838[0]._0_8_ = *ppcVar11;
    ppcVar11 = ppcVar11 + 1;
    if ((char *)local_838[0]._0_8_ == (char *)0x0) break;
LAB_0010605f:
    local_10ba = **(ushort **)local_838[0]._0_8_ << 8 | **(ushort **)local_838[0]._0_8_ >> 8;
    pcStack_10f0 = (code *)0x10607e;
    iVar3 = ptls_buffer__do_pushv(&local_10e0,&local_10ba,2);
    if (iVar3 != 0) goto LAB_001062ff;
  }
LAB_001060f2:
  local_10e0.base[sVar1 - 2] = (uint8_t)(local_10e0.off - sVar1 >> 8);
  local_10e0.base[sVar1 - 1] = (uint8_t)(local_10e0.off - sVar1);
  pcStack_10f0 = (code *)0x106119;
  iVar3 = ptls_buffer__do_pushv(&local_10e0,"",2);
  sVar1 = local_10e0.off;
  if (iVar3 == 0) {
    if (local_1040[0] != (ptls_cipher_suite_t *)0x0) {
      pppVar10 = local_1040;
      ppVar7 = local_1040[0];
      do {
        pppVar10 = pppVar10 + 1;
        local_10bc = ppVar7->id << 8 | ppVar7->id >> 8;
        pcStack_10f0 = (code *)0x106164;
        iVar3 = ptls_buffer__do_pushv(&local_10e0,&local_10bc,2);
        if (iVar3 != 0) goto LAB_001062ff;
        ppVar7 = *pppVar10;
      } while (ppVar7 != (ptls_cipher_suite_t *)0x0);
    }
    local_10e0.base[sVar1 - 2] = (uint8_t)(local_10e0.off - sVar1 >> 8);
    local_10e0.base[sVar1 - 1] = (uint8_t)(local_10e0.off - sVar1);
    local_10be = (undefined1)((ulong)local_10a8 >> 8);
    local_10bd = SUB81(local_10a8,0);
    pcStack_10f0 = (code *)0x1061ae;
    iVar3 = ptls_buffer__do_pushv(&local_10e0,&local_10be,2);
    if (iVar3 == 0) {
      local_1070 = local_10b8 >> 0x38 | (local_10b8 & 0xff000000000000) >> 0x28 |
                   (local_10b8 & 0xff0000000000) >> 0x18 | (local_10b8 & 0xff00000000) >> 8 |
                   (local_10b8 & 0xff000000) << 8 | (local_10b8 & 0xff0000) << 0x18 |
                   (local_10b8 & 0xff00) << 0x28 | local_10b8 << 0x38;
      pcStack_10f0 = (code *)0x1061d5;
      iVar3 = ptls_buffer__do_pushv(&local_10e0,&local_1070,8);
      if (iVar3 == 0) {
        uVar8 = (local_1088 + local_10b8) - 1;
        local_1078 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                     (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                     (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
                     (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
        pcStack_10f0 = (code *)0x106207;
        iVar3 = ptls_buffer__do_pushv(&local_10e0,&local_1078,8);
        if (iVar3 == 0) {
          pcStack_10f0 = (code *)0x106225;
          iVar3 = ptls_buffer__do_pushv(&local_10e0,"",2);
          if (iVar3 == 0) {
            lVar9 = -2;
            do {
              local_10e0.base[lVar9 + local_10e0.off] = '\0';
              lVar9 = lVar9 + 1;
            } while (lVar9 != 0);
            pcStack_10f0 = (code *)0x10626b;
            ptls_calc_hash(&ptls_openssl_sha256,local_1068,local_10e0.base,local_10e0.off);
            *(undefined4 *)(local_10e0.base + 2) = local_1068[0];
            if (local_1098 == (FILE *)0x0) {
              pcStack_10f0 = (code *)0x1062d2;
              fwrite(local_10e0.base,1,local_10e0.off,_stdout);
              pcStack_10f0 = (code *)0x1062da;
              fflush(_stdout);
            }
            else {
              pcStack_10f0 = (code *)0x10628b;
              pFVar6 = fopen((char *)local_1098,"wb");
              if (pFVar6 == (FILE *)0x0) {
                pcStack_10f0 = (code *)0x1062fd;
                main_cold_7();
              }
              else {
                pcStack_10f0 = (code *)0x1062aa;
                fwrite(local_10e0.base,1,local_10e0.off,pFVar6);
                pcStack_10f0 = (code *)0x1062b2;
                fclose(pFVar6);
              }
            }
            pcStack_10f0 = (code *)0x1062e4;
            ptls_buffer__release_memory(&local_10e0);
            return 0;
          }
        }
      }
    }
  }
LAB_001062ff:
  pcStack_10f0 = (code *)0x106309;
  ptls_buffer__release_memory(&local_10e0);
  pcStack_10f0 = (code *)0x106329;
  fwrite("failed to generate ESNI private structure.\n",0x2b,1,_stderr);
LAB_0010633c:
  pcStack_10f0 = (code *)0x106346;
  exit(1);
}

Assistant:

int main(int argc, char **argv)
{
    char const *published_sni = NULL;
    char const *file_output = NULL;
    ERR_load_crypto_strings();
    OpenSSL_add_all_algorithms();
#if !defined(OPENSSL_NO_ENGINE)
    /* Load all compiled-in ENGINEs */
    ENGINE_load_builtin_engines();
    ENGINE_register_all_ciphers();
    ENGINE_register_all_digests();
#endif

    struct {
        ptls_key_exchange_context_t *elements[256];
        size_t count;
    } key_exchanges = {{NULL}, 0};
    struct {
        ptls_cipher_suite_t *elements[256];
        size_t count;
    } cipher_suites = {{NULL}, 0};
    uint16_t padded_length = 260;
    uint64_t lifetime = 90 * 86400;

    int ch;

    while ((ch = getopt(argc, argv, "n:K:c:d:p:o:h")) != -1) {
        switch (ch) {
        case 'n':
            published_sni = optarg;
            break;
        case 'K': {
            FILE *fp;
            EVP_PKEY *pkey;

            if ((fp = fopen(optarg, "rt")) == NULL) {
                fprintf(stderr, "failed to open file:%s:%s\n", optarg, strerror(errno));
                exit(1);
            }

            if ((pkey = PEM_read_PrivateKey(fp, NULL, NULL, NULL)) == NULL) {
                fprintf(stderr, "failed to read private key from file:%s:%s\n", optarg, strerror(errno));
                exit(1);
            }
            fclose(fp);
            if (ptls_openssl_create_key_exchange(key_exchanges.elements + key_exchanges.count++, pkey) != 0) {
                fprintf(stderr, "unknown type of private key found in file:%s\n", optarg);
                exit(1);
            }
            EVP_PKEY_free(pkey);
        } break;
        case 'c': {
            size_t i;
            for (i = 0; ptls_openssl_cipher_suites[i] != NULL; ++i)
                if (strcasecmp(ptls_openssl_cipher_suites[i]->aead->name, optarg) == 0)
                    break;
            if (ptls_openssl_cipher_suites[i] == NULL) {
                fprintf(stderr, "unknown cipher-suite: %s\n", optarg);
                exit(1);
            }
            cipher_suites.elements[cipher_suites.count++] = ptls_openssl_cipher_suites[i];
        } break;
        case 'd':
            if (sscanf(optarg, "%" SCNu64, &lifetime) != 1 || lifetime == 0) {
                fprintf(stderr, "lifetime must be a positive integer\n");
                exit(1);
            }
            lifetime *= 86400; /* convert to seconds */
            break;
        case 'p':
#ifdef _WINDOWS
            if (sscanf_s(optarg, "%" SCNu16, &padded_length) != 1 || padded_length == 0) {
                fprintf(stderr, "padded length must be a positive integer\n");
                exit(1);
            }
#else
            if (sscanf(optarg, "%" SCNu16, &padded_length) != 1 || padded_length == 0) {
                fprintf(stderr, "padded length must be a positive integer\n");
                exit(1);
            }
#endif
            break;
        case 'o':
            file_output = optarg;
            break;
        case 'h':
            usage(argv[0], 0);
            break;
        default:
            usage(argv[0], 1);
            break;
        }
    }
    if (cipher_suites.count == 0)
        cipher_suites.elements[cipher_suites.count++] = &ptls_openssl_aes128gcmsha256;
    if (key_exchanges.count == 0) {
        fprintf(stderr, "no private key specified\n");
        exit(1);
    }

    argc -= optind;
    argv += optind;

    if (emit_esni(key_exchanges.elements, cipher_suites.elements, padded_length, time(NULL), lifetime, published_sni,
                  file_output) != 0) {
        fprintf(stderr, "failed to generate ESNI private structure.\n");
        exit(1);
    }

    return 0;
}